

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

char * google::protobuf::internal::ParseBigVarint(char *p,uint64 *out)

{
  uint32 uVar1;
  char **ptr;
  ulong *in_RSI;
  char *in_RDI;
  uint32_t i;
  uint64 res;
  uint32 tmp;
  char *pnew;
  uint local_34;
  char **in_stack_ffffffffffffffd0;
  char *local_8;
  
  uVar1 = DecodeTwoBytes(in_stack_ffffffffffffffd0);
  ptr = (char **)(ulong)(uVar1 >> 1);
  if ((short)uVar1 < 0) {
    for (local_34 = 1; local_34 < 5; local_34 = local_34 + 1) {
      uVar1 = DecodeTwoBytes(ptr);
      ptr = (char **)(((ulong)uVar1 - 2 << ((char)local_34 * '\x0e' - 1U & 0x3f)) + (long)ptr);
      if (-1 < (short)uVar1) {
        *in_RSI = (ulong)ptr;
        return in_RDI + (local_34 << 1);
      }
    }
    local_8 = (char *)0x0;
  }
  else {
    *in_RSI = (ulong)ptr;
    local_8 = in_RDI;
  }
  return local_8;
}

Assistant:

inline const char* ParseBigVarint(const char* p, uint64* out) {
  auto pnew = p;
  auto tmp = DecodeTwoBytes(&pnew);
  uint64 res = tmp >> 1;
  if (PROTOBUF_PREDICT_TRUE(std::int16_t(tmp) >= 0)) {
    *out = res;
    return pnew;
  }
  for (std::uint32_t i = 1; i < 5; i++) {
    pnew = p + 2 * i;
    tmp = DecodeTwoBytes(&pnew);
    res += (static_cast<std::uint64_t>(tmp) - 2) << (14 * i - 1);
    if (PROTOBUF_PREDICT_TRUE(std::int16_t(tmp) >= 0)) {
      *out = res;
      return pnew;
    }
  }
  return nullptr;
}